

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

void __thiscall
ADynamicLight::CollectWithinRadius
          (ADynamicLight *this,DVector3 *pos,subsector_t *subSec,float radius)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  seg_t *psVar4;
  void *linkto;
  long lVar5;
  double *pdVar6;
  line_t *plVar7;
  sector_t *psVar8;
  double dVar9;
  FLightNode *pFVar10;
  subsector_t *psVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ADynamicLight *this_00;
  DVector3 local_48;
  
  if (subSec != (subsector_t *)0x0) {
    subSec->validcount = validcount;
    this_00 = (ADynamicLight *)&subSec->lighthead;
    pFVar10 = AddLightNode((FLightNode **)this_00,subSec,this,&this->touching_subsectors);
    this->touching_subsectors = pFVar10;
    if (subSec->sector->validcount != validcount) {
      this_00 = (ADynamicLight *)&subSec->render_sector->lighthead;
      pFVar10 = AddLightNode((FLightNode **)this_00,subSec->sector,this,&this->touching_sector);
      this->touching_sector = pFVar10;
      subSec->sector->validcount = validcount;
    }
    if (subSec->numlines != 0) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        psVar4 = subSec->firstline;
        dVar9 = DistToSeg(this_00,pos,(seg_t *)((long)&psVar4->v1 + lVar14));
        if (dVar9 <= (double)radius) {
          linkto = *(void **)((long)&psVar4->sidedef + lVar14);
          if (((linkto != (void *)0x0) &&
              (lVar5 = *(long *)((long)&psVar4->linedef + lVar14), lVar5 != 0)) &&
             (*(int *)(lVar5 + 0x88) != validcount)) {
            pdVar6 = *(double **)((long)&psVar4->v1 + lVar14);
            this_00 = *(ADynamicLight **)((long)&psVar4->v2 + lVar14);
            dVar9 = *pdVar6;
            dVar1 = pdVar6[1];
            if (((double)(this_00->super_AActor).super_DThinker.super_DObject.Class - dVar1) *
                (dVar9 - pos->X) +
                ((double)(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject - dVar9)
                * (pos->Y - dVar1) <= 0.0) {
              *(int *)(lVar5 + 0x88) = validcount;
              this_00 = (ADynamicLight *)((long)linkto + 0xc0);
              pFVar10 = AddLightNode((FLightNode **)this_00,linkto,this,&this->touching_sides);
              this->touching_sides = pFVar10;
            }
          }
          lVar5 = *(long *)((long)&psVar4->linedef + lVar14);
          if (lVar5 != 0) {
            uVar2 = *(uint *)(lVar5 + 0x90);
            if (((linePortals.Array != (FLinePortal *)0x0 && uVar2 < linePortals.Count) &&
                (linePortals.Array[uVar2].mType == '\x03')) &&
               (plVar7 = linePortals.Array[uVar2].mDestination, plVar7->validcount != validcount)) {
              this_00 = (ADynamicLight *)
                        ((plVar7->v1->p).X + 103079215104.0 + (plVar7->delta).X * 0.5);
              psVar11 = R_PointInSubsector((fixed_t)this_00,
                                           SUB84((plVar7->v1->p).Y + 103079215104.0 +
                                                 (plVar7->delta).Y * 0.5,0));
              if (psVar11->validcount != validcount) {
                iVar12 = ((this->super_AActor).Sector)->PortalGroup;
                iVar3 = plVar7->frontsector->PortalGroup;
                uVar15 = 0;
                uVar16 = 0;
                local_48.Y = 0.0;
                if (iVar12 != iVar3) {
                  iVar12 = iVar3 * Displacements.size + iVar12;
                  dVar9 = Displacements.data.Array[iVar12].pos.X;
                  uVar15 = SUB84(dVar9,0);
                  uVar16 = (undefined4)((ulong)dVar9 >> 0x20);
                  local_48.Y = Displacements.data.Array[iVar12].pos.Y;
                }
                local_48.X = (double)CONCAT44(uVar16,uVar15) + (this->super_AActor).__Pos.X;
                local_48.Y = local_48.Y + (this->super_AActor).__Pos.Y;
                local_48.Z = (this->super_AActor).__Pos.Z;
                this_00 = this;
                CollectWithinRadius(this,&local_48,psVar11,radius);
              }
            }
          }
          lVar5 = *(long *)((long)&psVar4->PartnerSeg + lVar14);
          if (((lVar5 != 0) &&
              (psVar11 = *(subsector_t **)(lVar5 + 0x38), psVar11 != (subsector_t *)0x0)) &&
             (psVar11->validcount != validcount)) {
            this_00 = this;
            CollectWithinRadius(this,pos,psVar11,radius);
          }
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x48;
      } while (uVar13 < subSec->numlines);
    }
    psVar8 = subSec->sector;
    if ((psVar8->planes[1].Flags & 0x1d8U) == 0x100) {
      uVar2 = psVar8->Portals[1];
      dVar9 = (double)radius + (this->super_AActor).__Pos.Z;
      if (sectorPortals.Array[uVar2].mPlaneZ <= dVar9 && dVar9 != sectorPortals.Array[uVar2].mPlaneZ
         ) {
        plVar7 = subSec->firstline->linedef;
        psVar11 = R_PointInSubsector(SUB84((plVar7->v1->p).X + 103079215104.0 +
                                           (plVar7->delta).X * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.X,0),
                                     SUB84((plVar7->v1->p).Y + 103079215104.0 +
                                           (plVar7->delta).Y * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.Y,0));
        if (psVar11->validcount != validcount) {
          local_48.Z = (this->super_AActor).__Pos.Z;
          iVar12 = ((this->super_AActor).Sector)->PortalGroup;
          iVar3 = psVar11->sector->PortalGroup;
          local_48.X = 0.0;
          local_48.Y = 0.0;
          if (iVar12 != iVar3) {
            iVar12 = iVar3 * Displacements.size + iVar12;
            local_48.X = Displacements.data.Array[iVar12].pos.X;
            local_48.Y = Displacements.data.Array[iVar12].pos.Y;
          }
          local_48.Y = local_48.Y + (this->super_AActor).__Pos.Y;
          local_48.X = local_48.X + (this->super_AActor).__Pos.X;
          CollectWithinRadius(this,&local_48,psVar11,radius);
        }
      }
    }
    if ((psVar8->planes[0].Flags & 0x1d8U) == 0x100) {
      uVar2 = psVar8->Portals[0];
      if ((this->super_AActor).__Pos.Z - (double)radius < sectorPortals.Array[uVar2].mPlaneZ) {
        plVar7 = subSec->firstline->linedef;
        psVar11 = R_PointInSubsector(SUB84((plVar7->v1->p).X + 103079215104.0 +
                                           (plVar7->delta).X * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.X,0),
                                     SUB84((plVar7->v1->p).Y + 103079215104.0 +
                                           (plVar7->delta).Y * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.Y,0));
        if (psVar11->validcount != validcount) {
          local_48.Z = (this->super_AActor).__Pos.Z;
          iVar12 = ((this->super_AActor).Sector)->PortalGroup;
          iVar3 = psVar11->sector->PortalGroup;
          local_48.X = 0.0;
          local_48.Y = 0.0;
          if (iVar12 != iVar3) {
            iVar12 = iVar3 * Displacements.size + iVar12;
            local_48.X = Displacements.data.Array[iVar12].pos.X;
            local_48.Y = Displacements.data.Array[iVar12].pos.Y;
          }
          local_48.Y = local_48.Y + (this->super_AActor).__Pos.Y;
          local_48.X = local_48.X + (this->super_AActor).__Pos.X;
          CollectWithinRadius(this,&local_48,psVar11,radius);
        }
      }
    }
  }
  return;
}

Assistant:

void ADynamicLight::CollectWithinRadius(const DVector3 &pos, subsector_t *subSec, float radius)
{
	if (!subSec) return;

	subSec->validcount = ::validcount;

	touching_subsectors = AddLightNode(&subSec->lighthead, subSec, this, touching_subsectors);
	if (subSec->sector->validcount != ::validcount)
	{
		touching_sector = AddLightNode(&subSec->render_sector->lighthead, subSec->sector, this, touching_sector);
		subSec->sector->validcount = ::validcount;
	}

	for (unsigned int i = 0; i < subSec->numlines; i++)
	{
		seg_t * seg = subSec->firstline + i;

		// check distance from x/y to seg and if within radius add this seg and, if present the opposing subsector (lather/rinse/repeat)
		// If out of range we do not need to bother with this seg.
		if (DistToSeg(pos, seg) <= radius)
		{
			if (seg->sidedef && seg->linedef && seg->linedef->validcount != ::validcount)
			{
				// light is in front of the seg
				if ((pos.Y - seg->v1->fY()) * (seg->v2->fX() - seg->v1->fX()) + (seg->v1->fX() - pos.X) * (seg->v2->fY() - seg->v1->fY()) <= 0)
				{
					seg->linedef->validcount = validcount;
					touching_sides = AddLightNode(&seg->sidedef->lighthead, seg->sidedef, this, touching_sides);
				}
			}
			if (seg->linedef)
			{
				FLinePortal *port = seg->linedef->getPortal();
				if (port && port->mType == PORTT_LINKED)
				{
					line_t *other = port->mDestination;
					if (other->validcount != ::validcount)
					{
						subsector_t *othersub = R_PointInSubsector(other->v1->fPos() + other->Delta() / 2);
						if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(other), othersub, radius);
					}
				}
			}

			seg_t *partner = seg->PartnerSeg;
			if (partner)
			{
				subsector_t *sub = partner->Subsector;
				if (sub != NULL && sub->validcount != ::validcount)
				{
					CollectWithinRadius(pos, sub, radius);
				}
			}
		}
	}
	sector_t *sec = subSec->sector;
	if (!sec->PortalBlocksSight(sector_t::ceiling))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::ceiling) < Z() + radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::ceiling);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
	if (!sec->PortalBlocksSight(sector_t::floor))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::floor) > Z() - radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::floor);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
}